

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O2

stbi_uc * dds_load(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  uchar *puVar1;
  uchar uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uchar *puVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  uint32 uVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  stbi_uc *psVar16;
  ulong uVar17;
  int iVar18;
  char cVar19;
  int iVar20;
  bool bVar21;
  int local_140;
  stbi_uc compressed [8];
  DDS_header header;
  stbi_uc block [64];
  
  getn(s,(stbi_uc *)&header,0x80);
  if (header.dwMagic != 0x20534444) {
    return (stbi_uc *)0x0;
  }
  if (header.dwSize != 0x7c) {
    return (stbi_uc *)0x0;
  }
  if ((~header.dwFlags & 0x1007) != 0) {
    return (stbi_uc *)0x0;
  }
  if (header.sPixelFormat.dwSize != 0x20) {
    return (stbi_uc *)0x0;
  }
  if (((header.sPixelFormat.dwFlags & 0x44) == 0) || ((header.sCaps.dwCaps1 >> 0xc & 1) == 0)) {
    return (stbi_uc *)0x0;
  }
  s->img_x = header.dwWidth;
  s->img_y = header.dwHeight;
  s->img_n = 4;
  bVar13 = 1 < header.dwMipMapCount & (byte)(header.sCaps.dwCaps1 >> 0x16);
  iVar11 = (header.sCaps.dwCaps2 >> 9 & 1) * 5 + 1;
  if (header.dwWidth != header.dwHeight) {
    iVar11 = 1;
  }
  *x = header.dwWidth;
  *y = s->img_y;
  *comp = s->img_n;
  if ((header.sPixelFormat.dwFlags & 4) == 0) {
    iVar3 = (header.sPixelFormat.dwFlags & 1) + 3;
    s->img_n = iVar3;
    *comp = iVar3;
    local_140 = s->img_x * iVar11 * s->img_y * s->img_n;
    puVar6 = (uchar *)malloc((long)local_140);
    for (iVar3 = 0; iVar3 != iVar11; iVar3 = iVar3 + 1) {
      iVar8 = s->img_y * s->img_x * s->img_n;
      getn(s,puVar6 + (uint)(iVar8 * iVar3),iVar8);
      if (bVar13 != 0) {
        for (uVar10 = 1; header.dwMipMapCount != uVar10; uVar10 = uVar10 + 1) {
          uVar14 = s->img_x >> ((byte)uVar10 & 0x1f);
          uVar4 = s->img_y >> ((byte)uVar10 & 0x1f);
          if ((int)uVar14 < 2) {
            uVar14 = 1;
          }
          if ((int)uVar4 < 2) {
            uVar4 = 1;
          }
          skip(s,uVar14 * s->img_n * uVar4);
        }
      }
    }
    for (iVar3 = 0; iVar3 < local_140; iVar3 = iVar3 + s->img_n) {
      uVar2 = puVar6[iVar3];
      puVar6[iVar3] = puVar6[(long)iVar3 + 2];
      puVar6[(long)iVar3 + 2] = uVar2;
    }
  }
  else {
    if (header.sPixelFormat.dwFourCC + 0xca000000 < 0xfb000000) {
      return (stbi_uc *)0x0;
    }
    uVar14 = header.dwWidth + 3 >> 2;
    uVar10 = (header.dwHeight + 3 >> 2) * uVar14;
    local_140 = s->img_x * iVar11 * s->img_y * 4;
    puVar6 = (uchar *)malloc((long)local_140);
    if ((int)uVar10 < 1) {
      uVar10 = 0;
    }
    for (iVar3 = 0; iVar3 != iVar11; iVar3 = iVar3 + 1) {
      for (uVar4 = 0; uVar4 != uVar10; uVar4 = uVar4 + 1) {
        getn(s,compressed,8);
        if ((header.sPixelFormat.dwFourCC & 0x37000000) == 0x31000000) {
          stbi_decode_DXT1_block(block,compressed);
        }
        else {
          if (header.sPixelFormat.dwFourCC < 0x34000000) {
            stbi_decode_DXT23_alpha_block(block,compressed);
          }
          else {
            stbi_decode_DXT45_alpha_block(block,compressed);
          }
          getn(s,compressed,8);
          stbi_decode_DXT_color_block(block,compressed);
        }
        psVar16 = block;
        iVar20 = (uVar4 % uVar14) * 4;
        iVar18 = (uVar4 / uVar14) * 4;
        uVar5 = s->img_x;
        iVar8 = uVar5 + (uVar4 % uVar14) * -4;
        uVar7 = (ulong)(uint)(iVar8 * 4);
        if (iVar8 * 4 < 1) {
          uVar7 = 0;
        }
        iVar8 = s->img_y + (uVar4 / uVar14) * -4;
        if (iVar18 + 4U <= s->img_y) {
          iVar8 = 4;
        }
        if (iVar20 + 4U <= uVar5) {
          uVar7 = 0x10;
        }
        for (lVar9 = 0; lVar9 < iVar8; lVar9 = lVar9 + 1) {
          for (uVar17 = 0; uVar7 != uVar17; uVar17 = uVar17 + 1) {
            puVar6[uVar17 + (long)(int)(((uVar5 * iVar3 + iVar18 + (int)lVar9) * uVar5 + iVar20) * 4
                                       )] = psVar16[uVar17];
          }
          psVar16 = psVar16 + 0x10;
        }
      }
      if (bVar13 != 0) {
        cVar19 = '\x01';
        uVar4 = header.dwMipMapCount;
        while (uVar4 = uVar4 - 1, uVar4 != 0) {
          uVar5 = s->img_x >> (cVar19 + 2U & 0x1f);
          uVar15 = s->img_y >> (cVar19 + 2U & 0x1f);
          skip(s,(uVar15 + (uVar15 == 0)) * (uVar5 + (uVar5 == 0)) <<
                 ((header.sPixelFormat.dwFourCC & 0x37000000) != 0x31000000) + 3);
          cVar19 = cVar19 + '\x01';
        }
      }
    }
  }
  uVar12 = iVar11 * s->img_y;
  s->img_y = uVar12;
  *y = uVar12;
  iVar11 = s->img_n;
  if (iVar11 == 4) {
    lVar9 = 3;
    bVar21 = false;
    while ((lVar9 < local_140 && (!bVar21))) {
      puVar1 = puVar6 + lVar9;
      lVar9 = lVar9 + 4;
      bVar21 = *puVar1 != 0xff;
    }
    if (3 < req_comp - 1U) {
      if (bVar21) {
        return puVar6;
      }
      iVar11 = 3;
      puVar6 = convert_format(puVar6,4,3,s->img_x,s->img_y);
      goto LAB_0015d74d;
    }
    if (req_comp == 4) {
      return puVar6;
    }
  }
  else if (iVar11 == req_comp || req_comp - 5U < 0xfffffffc) {
    return puVar6;
  }
  puVar6 = convert_format(puVar6,iVar11,req_comp,s->img_x,s->img_y);
  iVar11 = s->img_n;
LAB_0015d74d:
  *comp = iVar11;
  return puVar6;
}

Assistant:

static stbi_uc *dds_load(stbi *s, int *x, int *y, int *comp, int req_comp)
{
	//	all variables go up front
	stbi_uc *dds_data = NULL;
	stbi_uc block[16*4];
	stbi_uc compressed[8];
	int flags, DXT_family;
	int has_alpha, has_mipmap;
	int is_compressed, cubemap_faces;
	int block_pitch, num_blocks;
	DDS_header header;
	int i, sz, cf;
	//	load the header
	if( sizeof( DDS_header ) != 128 )
	{
		return NULL;
	}
	getn( s, (stbi_uc*)(&header), 128 );
	//	and do some checking
	if( header.dwMagic != (('D' << 0) | ('D' << 8) | ('S' << 16) | (' ' << 24)) ) return NULL;
	if( header.dwSize != 124 ) return NULL;
	flags = DDSD_CAPS | DDSD_HEIGHT | DDSD_WIDTH | DDSD_PIXELFORMAT;
	if( (header.dwFlags & flags) != flags ) return NULL;
	/*	According to the MSDN spec, the dwFlags should contain
		DDSD_LINEARSIZE if it's compressed, or DDSD_PITCH if
		uncompressed.  Some DDS writers do not conform to the
		spec, so I need to make my reader more tolerant	*/
	if( header.sPixelFormat.dwSize != 32 ) return NULL;
	flags = DDPF_FOURCC | DDPF_RGB;
	if( (header.sPixelFormat.dwFlags & flags) == 0 ) return NULL;
	if( (header.sCaps.dwCaps1 & DDSCAPS_TEXTURE) == 0 ) return NULL;
	//	get the image data
	s->img_x = header.dwWidth;
	s->img_y = header.dwHeight;
	s->img_n = 4;
	is_compressed = (header.sPixelFormat.dwFlags & DDPF_FOURCC) / DDPF_FOURCC;
	has_alpha = (header.sPixelFormat.dwFlags & DDPF_ALPHAPIXELS) / DDPF_ALPHAPIXELS;
	has_mipmap = (header.sCaps.dwCaps1 & DDSCAPS_MIPMAP) && (header.dwMipMapCount > 1);
	cubemap_faces = (header.sCaps.dwCaps2 & DDSCAPS2_CUBEMAP) / DDSCAPS2_CUBEMAP;
	/*	I need cubemaps to have square faces	*/
	cubemap_faces &= (s->img_x == s->img_y);
	cubemap_faces *= 5;
	cubemap_faces += 1;
	block_pitch = (s->img_x+3) >> 2;
	num_blocks = block_pitch * ((s->img_y+3) >> 2);
	/*	let the user know what's going on	*/
	*x = s->img_x;
	*y = s->img_y;
	*comp = s->img_n;
	/*	is this uncompressed?	*/
	if( is_compressed )
	{
		/*	compressed	*/
		//	note: header.sPixelFormat.dwFourCC is something like (('D'<<0)|('X'<<8)|('T'<<16)|('1'<<24))
		DXT_family = 1 + (header.sPixelFormat.dwFourCC >> 24) - '1';
		if( (DXT_family < 1) || (DXT_family > 5) ) return NULL;
		/*	check the expected size...oops, nevermind...
			those non-compliant writers leave
			dwPitchOrLinearSize == 0	*/
		//	passed all the tests, get the RAM for decoding
		sz = (s->img_x)*(s->img_y)*4*cubemap_faces;
		dds_data = (unsigned char*)malloc( sz );
		/*	do this once for each face	*/
		for( cf = 0; cf < cubemap_faces; ++ cf )
		{
			//	now read and decode all the blocks
			for( i = 0; i < num_blocks; ++i )
			{
				//	where are we?
				int bx, by, bw=4, bh=4;
				int ref_x = 4 * (i % block_pitch);
				int ref_y = 4 * (i / block_pitch);
				//	get the next block's worth of compressed data, and decompress it
				if( DXT_family == 1 )
				{
					//	DXT1
					getn( s, compressed, 8 );
					stbi_decode_DXT1_block( block, compressed );
				} else if( DXT_family < 4 )
				{
					//	DXT2/3
					getn( s, compressed, 8 );
					stbi_decode_DXT23_alpha_block ( block, compressed );
					getn( s, compressed, 8 );
					stbi_decode_DXT_color_block ( block, compressed );
				} else
				{
					//	DXT4/5
					getn( s, compressed, 8 );
					stbi_decode_DXT45_alpha_block ( block, compressed );
					getn( s, compressed, 8 );
					stbi_decode_DXT_color_block ( block, compressed );
				}
				//	is this a partial block?
				if( ref_x + 4 > s->img_x )
				{
					bw = s->img_x - ref_x;
				}
				if( ref_y + 4 > s->img_y )
				{
					bh = s->img_y - ref_y;
				}
				//	now drop our decompressed data into the buffer
				for( by = 0; by < bh; ++by )
				{
					int idx = 4*((ref_y+by+cf*s->img_x)*s->img_x + ref_x);
					for( bx = 0; bx < bw*4; ++bx )
					{

						dds_data[idx+bx] = block[by*16+bx];
					}
				}
			}
			/*	done reading and decoding the main image...
				skip MIPmaps if present	*/
			if( has_mipmap )
			{
				int block_size = 16;
				if( DXT_family == 1 )
				{
					block_size = 8;
				}
				for( i = 1; i < header.dwMipMapCount; ++i )
				{
					int mx = s->img_x >> (i + 2);
					int my = s->img_y >> (i + 2);
					if( mx < 1 )
					{
						mx = 1;
					}
					if( my < 1 )
					{
						my = 1;
					}
					skip( s, mx*my*block_size );
				}
			}
		}/* per cubemap face */
	} else
	{
		/*	uncompressed	*/
		DXT_family = 0;
		s->img_n = 3;
		if( has_alpha )
		{
			s->img_n = 4;
		}
		*comp = s->img_n;
		sz = s->img_x*s->img_y*s->img_n*cubemap_faces;
		dds_data = (unsigned char*)malloc( sz );
		/*	do this once for each face	*/
		for( cf = 0; cf < cubemap_faces; ++ cf )
		{
			/*	read the main image for this face	*/
			getn( s, &dds_data[cf*s->img_x*s->img_y*s->img_n], s->img_x*s->img_y*s->img_n );
			/*	done reading and decoding the main image...
				skip MIPmaps if present	*/
			if( has_mipmap )
			{
				for( i = 1; i < header.dwMipMapCount; ++i )
				{
					int mx = s->img_x >> i;
					int my = s->img_y >> i;
					if( mx < 1 )
					{
						mx = 1;
					}
					if( my < 1 )
					{
						my = 1;
					}
					skip( s, mx*my*s->img_n );
				}
			}
		}
		/*	data was BGR, I need it RGB	*/
		for( i = 0; i < sz; i += s->img_n )
		{
			unsigned char temp = dds_data[i];
			dds_data[i] = dds_data[i+2];
			dds_data[i+2] = temp;
		}
	}
	/*	finished decompressing into RGBA,
		adjust the y size if we have a cubemap
		note: sz is already up to date	*/
	s->img_y *= cubemap_faces;
	*y = s->img_y;
	//	did the user want something else, or
	//	see if all the alpha values are 255 (i.e. no transparency)
	has_alpha = 0;
	if( s->img_n == 4)
	{
		for( i = 3; (i < sz) && (has_alpha == 0); i += 4 )
		{
			has_alpha |= (dds_data[i] < 255);
		}
	}
	if( (req_comp <= 4) && (req_comp >= 1) )
	{
		//	user has some requirements, meet them
		if( req_comp != s->img_n )
		{
			dds_data = convert_format( dds_data, s->img_n, req_comp, s->img_x, s->img_y );
			*comp = s->img_n;
		}
	} else
	{
		//	user had no requirements, only drop to RGB is no alpha
		if( (has_alpha == 0) && (s->img_n == 4) )
		{
			dds_data = convert_format( dds_data, 4, 3, s->img_x, s->img_y );
			*comp = 3;
		}
	}
	//	OK, done
	return dds_data;
}